

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O3

void __thiscall Database::initSlices(Database *this)

{
  undefined8 *puVar1;
  pointer pcVar2;
  __off_t _Var3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  DatabaseMetadata *pDVar7;
  undefined8 *puVar8;
  long *plVar9;
  char **ppcVar10;
  ulong uVar11;
  long *plVar12;
  uint uVar13;
  ulong uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  stat st;
  ulong *local_148;
  long local_140;
  ulong local_138 [2];
  ulong *local_128;
  long local_120;
  ulong local_118 [2];
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  stat local_c8;
  
  pcVar2 = (this->file_prefix)._M_dataplus._M_p;
  local_c8.st_dev = (__dev_t)&local_c8.st_nlink;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,pcVar2 + (this->file_prefix)._M_string_length);
  std::__cxx11::string::append((char *)&local_c8);
  iVar5 = open((char *)local_c8.st_dev,0x42,0x1a4);
  this->metadata_fd = iVar5;
  if ((__nlink_t *)local_c8.st_dev != &local_c8.st_nlink) {
    operator_delete((void *)local_c8.st_dev);
    iVar5 = this->metadata_fd;
  }
  if (iVar5 < 1) {
    __assert_fail("metadata_fd > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/database.cc"
                  ,0x4a,"void Database::initSlices()");
  }
  local_c8.__unused[1] = 0;
  local_c8.__unused[2] = 0;
  local_c8.st_blocks = 0;
  local_c8.st_atim.tv_sec = 0;
  local_c8.st_atim.tv_nsec = 0;
  local_c8.st_mtim.tv_sec = 0;
  local_c8.st_mtim.tv_nsec = 0;
  local_c8.st_ctim.tv_sec = 0;
  local_c8.st_ctim.tv_nsec = 0;
  local_c8.__unused[0] = 0;
  local_c8.st_dev = 0;
  local_c8.st_ino = 0;
  local_c8.st_nlink = 0;
  local_c8.st_mode = 0;
  local_c8.st_uid = 0;
  local_c8.st_gid = 0;
  local_c8.__pad0 = 0;
  local_c8.st_rdev = 0;
  local_c8.st_size = 0;
  local_c8.st_blksize = 0;
  fstat(iVar5,&local_c8);
  _Var3 = local_c8.st_size;
  if (local_c8.st_size == 0) {
    ftruncate(this->metadata_fd,0xc);
  }
  pDVar7 = (DatabaseMetadata *)mmap((void *)0x0,0x1000,3,1,this->metadata_fd,0);
  this->metadata = pDVar7;
  if (pDVar7 == (DatabaseMetadata *)0xffffffffffffffff) {
    __assert_fail("metadata != MAP_FAILED",
                  "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/database.cc"
                  ,0x56,"void Database::initSlices()");
  }
  if (_Var3 == 0) {
    pDVar7->sliceCount = 0;
    iVar5 = createNewSlice(this);
    this->slice_fd[0] = iVar5;
    mapSlice(this,iVar5,0);
    ppcVar10 = this->slices;
  }
  else {
    if (pDVar7->sliceCount == 0) {
      uVar14 = 0xffffffff;
    }
    else {
      uVar14 = 0;
      do {
        local_148 = local_138;
        pcVar2 = (this->file_prefix)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,pcVar2,pcVar2 + (this->file_prefix)._M_string_length);
        std::__cxx11::string::append((char *)&local_148);
        uVar13 = 1;
        if (9 < uVar14) {
          uVar4 = 4;
          uVar11 = uVar14;
          do {
            uVar13 = uVar4;
            uVar6 = (uint)uVar11;
            if (uVar6 < 100) {
              uVar13 = uVar13 - 2;
              goto LAB_001046cf;
            }
            if (uVar6 < 1000) {
              uVar13 = uVar13 - 1;
              goto LAB_001046cf;
            }
            if (uVar6 < 10000) goto LAB_001046cf;
            uVar11 = (uVar11 & 0xffffffff) / 10000;
            uVar4 = uVar13 + 4;
          } while (99999 < uVar6);
          uVar13 = uVar13 + 1;
        }
LAB_001046cf:
        local_128 = local_118;
        std::__cxx11::string::_M_construct((ulong)&local_128,(char)uVar13);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_128,uVar13,(uint)uVar14);
        uVar11 = 0xf;
        if (local_148 != local_138) {
          uVar11 = local_138[0];
        }
        if (uVar11 < (ulong)(local_120 + local_140)) {
          uVar11 = 0xf;
          if (local_128 != local_118) {
            uVar11 = local_118[0];
          }
          if (uVar11 < (ulong)(local_120 + local_140)) goto LAB_00104747;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,(ulong)local_148);
        }
        else {
LAB_00104747:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_128);
        }
        puVar1 = puVar8 + 2;
        if ((undefined8 *)*puVar8 == puVar1) {
          local_f8 = *puVar1;
          uStack_f0 = puVar8[3];
          local_108 = &local_f8;
        }
        else {
          local_f8 = *puVar1;
          local_108 = (undefined8 *)*puVar8;
        }
        local_100 = puVar8[1];
        *puVar8 = puVar1;
        puVar8[1] = 0;
        *(undefined1 *)puVar1 = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_108);
        plVar12 = plVar9 + 2;
        if ((long *)*plVar9 == plVar12) {
          local_d8 = *plVar12;
          lStack_d0 = plVar9[3];
          local_e8 = &local_d8;
        }
        else {
          local_d8 = *plVar12;
          local_e8 = (long *)*plVar9;
        }
        local_e0 = plVar9[1];
        *plVar9 = (long)plVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if (local_108 != &local_f8) {
          operator_delete(local_108);
        }
        if (local_128 != local_118) {
          operator_delete(local_128);
        }
        if (local_148 != local_138) {
          operator_delete(local_148);
        }
        iVar5 = open((char *)local_e8,2,0x1a4);
        this->slice_fd[uVar14] = iVar5;
        if (iVar5 < 1) {
          __assert_fail("slice_fd[i] > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/database.cc"
                        ,0x61,"void Database::initSlices()");
        }
        mapSlice(this,iVar5,(uint)uVar14);
        if (local_e8 != &local_d8) {
          operator_delete(local_e8);
        }
        uVar14 = uVar14 + 1;
        uVar13 = this->metadata->sliceCount;
      } while (uVar14 < uVar13);
      uVar14 = (ulong)(uVar13 - 1);
    }
    ppcVar10 = this->slices + uVar14;
  }
  this->currentSlice = *ppcVar10;
  return;
}

Assistant:

void Database::initSlices() {
    metadata_fd = open((file_prefix + ".metadata").c_str(), O_RDWR|O_CREAT, 0644);
    assert(metadata_fd > 0);
    struct stat st = {};
    fstat(metadata_fd, &st);

    bool need_init = false;

    if (st.st_size == 0) {
        ftruncate(metadata_fd, sizeof(DatabaseMetadata));
        need_init = true;
    }

    metadata = reinterpret_cast<DatabaseMetadata*>(mmap(nullptr, 4096, PROT_READ | PROT_WRITE, MAP_SHARED, metadata_fd, 0));
    assert(metadata != MAP_FAILED);

    if (need_init) {
        metadata->sliceCount = 0;
        slice_fd[0] = createNewSlice();
        mapSlice(slice_fd[0], 0);
        currentSlice = slices[0];
    } else {
        for (int i = 0; i < metadata->sliceCount; ++i) {
            auto filename = file_prefix + "." + std::to_string(i) + ".data";
            slice_fd[i] = open(filename.c_str(), O_RDWR, 0644);
            assert(slice_fd[i] > 0);
            mapSlice(slice_fd[i], i);
        }
//        printf("%d %d %d\n", *sliceCount, *currentSliceNumber, *currentOffset);
        currentSlice = slices[metadata->sliceCount - 1];
    }


}